

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCString.h
# Opt level: O2

__ssize_t GenICam_3_4::getline(char **__lineptr,size_t *__n,FILE *__stream)

{
  string tmp;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)__lineptr,(string *)&local_38,(char)__stream);
  (**(code **)(*__n + 0x38))(__n,local_38,local_30);
  std::__cxx11::string::~string((string *)&local_38);
  return (__ssize_t)__lineptr;
}

Assistant:

inline std::istream &  getline(std::istream& is, GENICAM_NAMESPACE::gcstring& str, char delim)
    {
        try
        {
            std::string tmp;
            std::getline(is, tmp, delim);
            str.assign(tmp.c_str(), tmp.size());
        }
        catch(std::bad_alloc &)
        {
            ThrowBadAlloc(__FILE__, __LINE__);
        }
        return is;
    }